

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

XmlWriter * __thiscall
doctest::anon_unknown_14::XmlWriter::writeAttribute(XmlWriter *this,string *name,bool attribute)

{
  char *pcVar1;
  ostream *poVar2;
  byte in_DL;
  string *in_RSI;
  XmlWriter *in_RDI;
  
  poVar2 = std::operator<<(in_RDI->m_os,' ');
  poVar2 = std::operator<<(poVar2,in_RSI);
  poVar2 = std::operator<<(poVar2,"=\"");
  pcVar1 = "superMap->contains(key(\"aa\")), false";
  if ((in_DL & 1) != 0) {
    pcVar1 = "superMap->contains(key(\"aa\")), true";
  }
  poVar2 = std::operator<<(poVar2,pcVar1 + 0x1f);
  std::operator<<(poVar2,'\"');
  return in_RDI;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( std::string const& name, bool attribute ) {
        m_os << ' ' << name << "=\"" << ( attribute ? "true" : "false" ) << '"';
        return *this;
    }